

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O2

char * url_encode(char *s,size_t n)

{
  char cVar1;
  size_t __size;
  ulong in_RAX;
  char *__dest;
  uint uVar2;
  char *__src;
  char ch [2];
  undefined8 uStack_38;
  
  __size = n * 2;
  uStack_38 = in_RAX;
  __dest = (char *)malloc(__size);
  if (__dest != (char *)0x0) {
    *__dest = '\0';
    for (uVar2 = 0; uVar2 < n; uVar2 = uVar2 + 1) {
      cVar1 = s[uVar2];
      if (cVar1 == '\n') {
        __src = "%0A";
      }
      else if (cVar1 == '=') {
        __src = "%3D";
      }
      else if (cVar1 == '-') {
        __src = "%2D";
      }
      else if (cVar1 == '+') {
        __src = "%2B";
      }
      else {
        uStack_38 = (ulong)CONCAT16(cVar1,(undefined6)uStack_38);
        __src = (char *)((long)&uStack_38 + 6);
      }
      strncat(__dest,__src,__size);
    }
    __dest[__size - 1] = '\0';
  }
  return __dest;
}

Assistant:

char * url_encode(char *s, size_t n) {
	char	*r;
	size_t	len;
	unsigned int     i;
	char    ch[2];

	/* Allocate 2 times bigger space than the original string */
	len = 2 * n;
	r = (char *)malloc(len);
	if (r == NULL) {
		return NULL;
	}
#ifdef WIN32
	strcpy_s(r, sizeof(r), "");
#else
	strcpy(r, "");
#endif

	/* Copy data */
	for (i = 0; i < n; i++) {
		switch (*(s+i)) {
			case '+':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%2B", len);
				strncat(r, "%2B", len);
#else
				strncat(r, "%2B", len);
#endif
				break;
			case '-':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%2D", len);
				strncat(r, "%2D", len);
#else
				strncat(r, "%2D", len);
#endif
				break;
			case '=':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%3D", len);
				strncat(r, "%3D", len);
#else
				strncat(r, "%3D", len);
#endif
				break;
			case '\n':
#ifdef WIN32
				//strncat_s(r, sizeof(r), "%0A", len);
				strncat(r, "%0A", len);
#else
				strncat(r, "%0A", len);
#endif
				break;
			default:
				ch[0] = *(s+i);
				ch[1] = '\0';
#ifdef WIN32
				//strncat_s(r, sizeof(r), ch, len);
				strncat(r, ch, len);
#else
				strncat(r, ch, len);
#endif
				break;
		}
	}
	r[len-1] = '\0';
	return r;
}